

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O3

err_t EBML_ElementRenderHead
                (ebml_element *Element,stream *Output,bool_t bKeepPosition,filepos_t *Rendered)

{
  uint8_t SizeLength;
  uint uVar1;
  filepos_t fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  long lVar7;
  void *pvVar8;
  err_t eVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong CodedSize;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar17;
  int iVar18;
  undefined1 auVar15 [16];
  int iVar19;
  undefined1 auVar16 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar21 [16];
  uint8_t FinalHead [12];
  size_t i;
  uint8_t auStack_48 [16];
  undefined1 local_38 [8];
  
  if (Output != (stream *)0x0) {
    lVar7 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
    uVar1 = Element->Context->Id;
    lVar12 = 1;
    if ((0xff < uVar1) && (lVar12 = 2, 0xffff < uVar1)) {
      lVar12 = 4 - (ulong)(uVar1 < 0x1000000);
    }
    lVar10 = lVar12 + -1;
    auVar15._8_4_ = (int)lVar10;
    auVar15._0_8_ = lVar10;
    auVar15._12_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar15 = auVar15 ^ _DAT_00115c70;
    iVar14 = auVar15._0_4_;
    iVar17 = auVar15._4_4_;
    iVar18 = auVar15._8_4_;
    iVar19 = auVar15._12_4_;
    auVar20._0_4_ = -(uint)(iVar17 == -0x80000000);
    auVar20._4_4_ = -(uint)(iVar17 == -0x80000000);
    auVar20._8_4_ = -(uint)(iVar19 == -0x80000000);
    auVar20._12_4_ = -(uint)(iVar19 == -0x80000000);
    auVar21._4_4_ = -(uint)(iVar14 < -0x80000000);
    auVar21._0_4_ = -(uint)(iVar14 < -0x80000000);
    auVar21._8_4_ = -(uint)(iVar18 < -0x7fffffff);
    auVar21._12_4_ = -(uint)(iVar18 < -0x7fffffff);
    auVar20 = auVar20 & auVar21;
    auVar21 = pshuflw(in_XMM4,auVar20,0xe8);
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar3,auVar21 ^ auVar3);
    if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      auStack_48[lVar12 + 3] = (uint8_t)uVar1;
    }
    auVar21 = packssdw(auVar20,auVar20);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar4,auVar21 ^ auVar4);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21._0_4_ >> 8 & 1) != 0) {
      auStack_48[lVar12 + 2] = (uint8_t)(uVar1 >> 8);
    }
    auVar13._0_4_ = -(uint)(DAT_00115c80._4_4_ == iVar17);
    auVar13._4_4_ = -(uint)(DAT_00115c80._4_4_ == iVar17);
    auVar13._8_4_ = -(uint)(DAT_00115c80._12_4_ == iVar19);
    auVar13._12_4_ = -(uint)(DAT_00115c80._12_4_ == iVar19);
    auVar5._4_4_ = -(uint)(iVar14 < (int)DAT_00115c80);
    auVar5._0_4_ = -(uint)(iVar14 < (int)DAT_00115c80);
    auVar5._8_4_ = -(uint)(iVar18 < DAT_00115c80._8_4_);
    auVar5._12_4_ = -(uint)(iVar18 < DAT_00115c80._8_4_);
    auVar13 = auVar13 & auVar5;
    auVar21 = packssdw(_DAT_00115c80,auVar13);
    auVar16._8_4_ = 0xffffffff;
    auVar16._0_8_ = 0xffffffffffffffff;
    auVar16._12_4_ = 0xffffffff;
    auVar21 = packssdw(auVar21 ^ auVar16,auVar21 ^ auVar16);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
      auStack_48[lVar12 + 1] = (uint8_t)(uVar1 >> 0x10);
    }
    auVar21 = pshufhw(auVar13,auVar13,0x84);
    auVar21 = packssdw(auVar21 ^ auVar16,auVar21 ^ auVar16);
    auVar21 = packsswb(auVar21,auVar21);
    if ((auVar21._0_4_ >> 0x18 & 1) != 0) {
      auStack_48[lVar12] = (uint8_t)(uVar1 >> 0x18);
    }
    fVar2 = Element->DataSize;
    SizeLength = Element->SizeLength;
    lVar11 = 1;
    pvVar8 = Node_GetData((node *)Element,0x100,1);
    bVar6 = EBML_CodedSizeLength(fVar2,SizeLength,(ulong)(pvVar8 == (void *)0x0));
    fVar2 = Element->DataSize;
    CodedSize = (ulong)bVar6;
    pvVar8 = Node_GetData((node *)Element,0x100,1);
    EBML_CodedValueLength(fVar2,CodedSize,auStack_48 + lVar12 + 4,(ulong)(pvVar8 == (void *)0x0));
    eVar9 = (**(code **)((long)(Output->Base).VMT + 0x70))
                      (Output,auStack_48 + 4,lVar12 + CodedSize,local_38);
    lVar10 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
    if (bKeepPosition == 0) {
      lVar12 = lVar10 - (lVar12 + CodedSize);
      Element->ElementPosition = lVar12;
      uVar1 = Element->Context->Id;
      if ((0xff < uVar1) && (lVar11 = 2, 0xffff < uVar1)) {
        lVar11 = 4 - (ulong)(uVar1 < 0x1000000);
      }
      lVar11 = lVar11 + lVar12;
      Element->SizePosition = lVar11;
      Element->EndPosition = lVar11 + CodedSize + Element->DataSize;
    }
    if (Rendered != (filepos_t *)0x0) {
      *Rendered = lVar10 - lVar7;
    }
    return eVar9;
  }
  __assert_fail("(const void*)(Output)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                ,0x134,
                "err_t EBML_ElementRenderHead(ebml_element *, struct stream *, bool_t, filepos_t *)"
               );
}

Assistant:

err_t EBML_ElementRenderHead(ebml_element *Element, struct stream *Output, bool_t bKeepPosition, filepos_t *Rendered)
{
    err_t Err;
    uint8_t FinalHead[4+8]; // Class D + 64 bits coded size
    size_t i,FinalHeadSize;
    int CodedSize;
    filepos_t PosAfter,PosBefore = Stream_Seek(Output,0,SEEK_CUR);

    FinalHeadSize = EBML_FillBufferID(FinalHead,sizeof(FinalHead),Element->Context->Id);

    CodedSize = EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element));
    EBML_CodedValueLength(Element->DataSize, CodedSize, &FinalHead[FinalHeadSize], EBML_ElementIsFiniteSize(Element));
    FinalHeadSize += CodedSize;

    Err = Stream_Write(Output, FinalHead, FinalHeadSize, &i);
    PosAfter = Stream_Seek(Output,0,SEEK_CUR);
    if (!bKeepPosition) {
        Element->ElementPosition = PosAfter - FinalHeadSize;
        Element->SizePosition = Element->ElementPosition + GetIdLength(Element->Context->Id);
        Element->EndPosition = Element->SizePosition + CodedSize + Element->DataSize;
    }
    if (Rendered)
        *Rendered = PosAfter - PosBefore;
    return Err;
}